

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O1

TPZManVector<long_double,_3> * __thiscall
TPZManVector<long_double,_3>::operator=
          (TPZManVector<long_double,_3> *this,TPZManVector<long_double,_3> *copy)

{
  longdouble *plVar1;
  longdouble *plVar2;
  long lVar3;
  ulong uVar4;
  
  if (this != copy) {
    uVar4 = (copy->super_TPZVec<long_double>).fNElements;
    if (((this->super_TPZVec<long_double>).fNAlloc < (long)uVar4) &&
       (plVar2 = (this->super_TPZVec<long_double>).fStore,
       plVar2 != this->fExtAlloc && plVar2 != (longdouble *)0x0)) {
      operator_delete__(plVar2);
      (this->super_TPZVec<long_double>).fStore = (longdouble *)0x0;
      (this->super_TPZVec<long_double>).fNAlloc = 0;
    }
    if ((long)uVar4 < 4) {
      plVar2 = (this->super_TPZVec<long_double>).fStore;
      if (plVar2 != (longdouble *)0x0 && plVar2 != this->fExtAlloc) {
        operator_delete__(plVar2);
      }
      (this->super_TPZVec<long_double>).fNAlloc = 0;
      (this->super_TPZVec<long_double>).fStore = this->fExtAlloc;
    }
    else if ((this->super_TPZVec<long_double>).fNAlloc < (long)uVar4) {
      plVar2 = (longdouble *)operator_new__(-(ulong)(uVar4 >> 0x3c != 0) | uVar4 << 4);
      (this->super_TPZVec<long_double>).fStore = plVar2;
      (this->super_TPZVec<long_double>).fNAlloc = uVar4;
    }
    (this->super_TPZVec<long_double>).fNElements = uVar4;
    if (0 < (long)uVar4) {
      plVar2 = (copy->super_TPZVec<long_double>).fStore;
      plVar1 = (this->super_TPZVec<long_double>).fStore;
      lVar3 = 0;
      do {
        *(unkbyte10 *)((long)plVar1 + lVar3) = *(unkbyte10 *)((long)plVar2 + lVar3);
        lVar3 = lVar3 + 0x10;
        uVar4 = uVar4 - 1;
      } while (uVar4 != 0);
    }
  }
  return this;
}

Assistant:

TPZManVector< T, NumExtAlloc >& TPZManVector< T, NumExtAlloc >::operator=(const TPZManVector< T, NumExtAlloc >& copy) {
    // Checking auto assignment.
    if (this != &copy) {
      const int64_t nel = copy.NElements();

      if (nel > this->fNAlloc && this->fStore && this->fStore != fExtAlloc) {
        delete[] this->fStore;
        this->fStore = 0;
        this->fNAlloc = 0;
      }

      if (nel <= NumExtAlloc) {
        if (this->fStore != fExtAlloc) {
          delete[] this->fStore;
        }
        this->fNAlloc = 0;
        this->fStore = fExtAlloc;
        this->fNElements = nel;
      } else if (this->fNAlloc >= nel) {
        this->fNElements = nel;
      } else {
        this->fStore = new T[nel];
        this->fNAlloc = nel;
        this->fNElements = nel;
      }

      for (int64_t i = 0; i < nel; i++) {
        this->fStore[i] = copy.fStore[i];
      }
    }
    return *this;
}